

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoShuffle.c
# Opt level: O2

void Extra_ShuffleTest(reo_man *pReo,DdManager *dd,DdNode *Func)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  int iVar4;
  bool bVar5;
  int pOrder [1000];
  int pOrderInv [1000];
  
  if (dd->size < 1000) {
    srand(0x12341234);
    uVar1 = Cudd_SupportSize(dd,Func);
    if (1 < (int)uVar1) {
      for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
        pOrder[uVar3] = (int)uVar3;
      }
      iVar4 = 0x78;
      while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
        iVar2 = rand();
        iVar2 = iVar2 % (int)(uVar1 - 1);
        *(ulong *)(pOrder + iVar2) =
             CONCAT44((int)*(undefined8 *)(pOrder + iVar2),
                      (int)((ulong)*(undefined8 *)(pOrder + iVar2) >> 0x20));
      }
      for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
        pOrderInv[pOrder[uVar3]] = (int)uVar3;
      }
      n = Extra_bddRemapUp(dd,Func);
      Cudd_Ref(n);
      Abc_Clock();
      n_00 = reoShuffle(pReo,dd,n,pOrder,pOrderInv);
      Cudd_Ref(n_00);
      Abc_Clock();
      n_01 = Cudd_bddPermute(dd,n,pOrderInv);
      Cudd_Ref(n_01);
      if (n_01 != n_00) {
        puts("REO: Internal verification has failed!");
        fflush(_stdout);
      }
      Cudd_RecursiveDeref(dd,n_01);
      Cudd_RecursiveDeref(dd,n_00);
      Cudd_RecursiveDeref(dd,n);
    }
    return;
  }
  __assert_fail("dd->size < 1000",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/reo/reoShuffle.c"
                ,0xa7,"void Extra_ShuffleTest(reo_man *, DdManager *, DdNode *)");
}

Assistant:

void Extra_ShuffleTest( reo_man * pReo, DdManager * dd, DdNode * Func )
{
//    extern int runtime1, runtime2;

	DdNode * Temp, * bRemap;
    int nSuppSize, OffSet, Num, i;
    abctime clk;
	int pOrder[1000], pOrderInv[1000];
    assert( dd->size < 1000 );

    srand( 0x12341234 );
    nSuppSize = Cudd_SupportSize( dd, Func );
    if ( nSuppSize < 2 )
        return;

    for ( i = 0; i < nSuppSize; i++ )
        pOrder[i] = i;
    for ( i = 0; i < 120; i++ )
    {
        OffSet = rand() % (nSuppSize - 1);
        Num = pOrder[OffSet];
        pOrder[OffSet] = pOrder[OffSet+1];
        pOrder[OffSet+1] = Num;
    }
    for ( i = 0; i < nSuppSize; i++ )
        pOrderInv[pOrder[i]] = i;

/*
    printf( "Permutation: " );
    for ( i = 0; i < nSuppSize; i++ )
        printf( "%d ", pOrder[i] );
    printf( "\n" );
    printf( "Inverse permutation: " );
    for ( i = 0; i < nSuppSize; i++ )
        printf( "%d ", pOrderInv[i] );
    printf( "\n" );
*/

    // create permutation
//    Extra_ReorderSetVerification( pReo, 1 );
    bRemap = Extra_bddRemapUp( dd, Func );  Cudd_Ref( bRemap );

clk = Abc_Clock();
	Temp  = reoShuffle( pReo, dd, bRemap, pOrder, pOrderInv );  Cudd_Ref( Temp );
//runtime1 += Abc_Clock() - clk;

//printf( "Initial = %d. Final = %d.\n", Cudd_DagSize(bRemap), Cudd_DagSize(Temp)  );

	{
		DdNode * bFuncPerm;
clk = Abc_Clock();
		bFuncPerm = Cudd_bddPermute( dd, bRemap, pOrderInv );  Cudd_Ref( bFuncPerm );
//runtime2 += Abc_Clock() - clk;
		if ( bFuncPerm != Temp )
		{
			printf( "REO: Internal verification has failed!\n" );
			fflush( stdout );
		}
		Cudd_RecursiveDeref( dd, bFuncPerm );
	}

	Cudd_RecursiveDeref( dd, Temp );
	Cudd_RecursiveDeref( dd, bRemap );
}